

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O2

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::matchNextAux
          (InstMatcher *this,TermList queryTerm,TermList nodeTerm,bool separate)

{
  bool bVar1;
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec>
  *ppVar2;
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec>
  *ppVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  TermList var;
  TermList var_00;
  ulong uVar9;
  socklen_t __len;
  bool bVar10;
  uint __fd;
  int iVar11;
  ulong uVar12;
  TermSpec TVar13;
  TermSpec local_68;
  uint local_54;
  uint local_50;
  undefined4 local_4c;
  undefined8 local_48;
  Term *pTStack_40;
  
  local_4c = (undefined4)CONCAT71(in_register_00000009,separate);
  local_68.q = false;
  local_68.t._content = 2;
  __fd = (uint)queryTerm._content;
  if ((~__fd & 3) == 0) {
    bVar4 = findSpecVarBinding(this,(uint)(queryTerm._content >> 2),&local_68);
    if (!bVar4) goto LAB_002bb666;
    if ((local_68.q & 1U) == 0) goto LAB_002bb36e;
  }
  else {
    local_68.q = true;
    local_68.t._content = queryTerm._content;
  }
  if ((((uint)local_68.t._content & 3) != 1) || (bVar4 = isBound(this,local_68.t), bVar4)) {
LAB_002bb36e:
    if ((((((nodeTerm._content & 3) == 0) && ((*(byte *)(nodeTerm._content + 0x28) & 8) != 0)) &&
         (bVar4 = Kernel::Term::ground((Term *)nodeTerm._content), bVar4)) &&
        ((local_68.q == true && ((local_68.t._content & 3) == 0)))) &&
       (bVar4 = Kernel::Term::ground((Term *)local_68.t._content), bVar4)) {
      bVar4 = local_68.t._content == nodeTerm._content;
LAB_002bb63f:
      if ((char)local_4c == '\x01' && bVar4 == false) {
        backtrack(this);
        return false;
      }
      return bVar4;
    }
    if ((matchNextAux(Kernel::TermList,Kernel::TermList,bool)::toDo == '\0') &&
       (iVar7 = __cxa_guard_acquire(&matchNextAux(Kernel::TermList,Kernel::TermList,bool)::toDo),
       iVar7 != 0)) {
      matchNextAux::toDo._cursor =
           (pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec>
            *)0x0;
      matchNextAux::toDo._end =
           (pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec>
            *)0x0;
      matchNextAux::toDo._capacity = 0;
      matchNextAux::toDo._stack =
           (pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec>
            *)0x0;
      __cxa_atexit(Lib::
                   Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec>_>
                   ::~Stack,&matchNextAux::toDo,&__dso_handle);
      __cxa_guard_release(&matchNextAux(Kernel::TermList,Kernel::TermList,bool)::toDo);
    }
    if ((matchNextAux(Kernel::TermList,Kernel::TermList,bool)::dsit == '\0') &&
       (iVar7 = __cxa_guard_acquire(&matchNextAux(Kernel::TermList,Kernel::TermList,bool)::dsit),
       iVar7 != 0)) {
      matchNextAux::dsit.super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>._refCnt
           = 0;
      matchNextAux::dsit.super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>.
      _vptr_IteratorCore = (_func_int **)&PTR__DisagreementSetIterator_009ffc30;
      matchNextAux::dsit._stack._capacity = 0;
      matchNextAux::dsit._stack._stack = (TermList **)0x0;
      matchNextAux::dsit._stack._cursor = (TermList **)0x0;
      matchNextAux::dsit._stack._end = (TermList **)0x0;
      matchNextAux::dsit._arg2._content = 2;
      matchNextAux::dsit._arg1._content = 2;
      __cxa_atexit(Kernel::DisagreementSetIterator::~DisagreementSetIterator,&matchNextAux::dsit,
                   &__dso_handle);
      __cxa_guard_release(&matchNextAux(Kernel::TermList,Kernel::TermList,bool)::dsit);
    }
    matchNextAux::toDo._cursor = matchNextAux::toDo._stack;
    local_48 = CONCAT71(local_68._1_7_,local_68.q);
    pTStack_40 = (Term *)local_68.t._content;
    if (matchNextAux::toDo._stack == matchNextAux::toDo._end) {
      Lib::
      Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec>_>
      ::expand(&matchNextAux::toDo);
    }
    ppVar2 = matchNextAux::toDo._cursor;
    *(undefined8 *)&(matchNextAux::toDo._cursor)->first = local_48;
    (ppVar2->first).t._content = (uint64_t)pTStack_40;
    (ppVar2->second).q = false;
    (ppVar2->second).t._content = nodeTerm._content;
    matchNextAux::toDo._cursor = matchNextAux::toDo._cursor + 1;
    do {
      if (matchNextAux::toDo._cursor == matchNextAux::toDo._stack) {
        return true;
      }
      bVar4 = matchNextAux::toDo._cursor[-1].first.q;
      ppVar2 = matchNextAux::toDo._cursor + -1;
      bVar1 = matchNextAux::toDo._cursor[-1].second.q;
      ppVar3 = matchNextAux::toDo._cursor + -1;
      matchNextAux::toDo._cursor = matchNextAux::toDo._cursor + -1;
      Kernel::DisagreementSetIterator::reset
                (&matchNextAux::dsit,(TermList)(ppVar2->first).t._content,
                 (TermList)(ppVar3->second).t._content,(bool)((bVar1 ^ bVar4) & 1));
      local_50 = (uint)(bVar1 & 1U);
      local_54 = (uint)(bVar4 & 1U);
      while (bVar5 = Kernel::DisagreementSetIterator::hasNext(&matchNextAux::dsit),
            var_00 = matchNextAux::dsit._arg2, var = matchNextAux::dsit._arg1, bVar5) {
        uVar8 = matchNextAux::dsit._arg2._content & 3;
        bVar5 = uVar8 != 1;
        if ((bVar1 & 1U) != 0) {
          bVar5 = uVar8 != 0;
        }
        uVar12 = matchNextAux::dsit._arg2._content & 3;
        if (uVar12 == 0) {
          bVar5 = uVar8 != 0;
        }
        uVar8 = matchNextAux::dsit._arg1._content & 3;
        bVar10 = uVar8 != 1;
        if ((bVar4 & 1U) != 0) {
          bVar10 = uVar8 != 0;
        }
        uVar9 = matchNextAux::dsit._arg1._content & 3;
        matchNextAux::dsit._arg1._content = 2;
        if (uVar9 == 0) {
          bVar10 = uVar8 != 0;
        }
        if ((!bVar10) && (!bVar5)) {
          bVar4 = false;
          goto LAB_002bb63f;
        }
        iVar7 = (int)uVar9;
        __len = (socklen_t)matchNextAux::dsit._arg2._content;
        if (((iVar7 != 1) || ((bVar4 & 1U) == 0)) || (bVar6 = isBound(this,var), bVar6)) {
          iVar11 = (int)uVar12;
          if ((((iVar11 != 1) || ((bVar1 & 1U) == 0)) && (iVar11 != 3)) ||
             (bVar6 = isBound(this,var_00), bVar6)) {
            if ((iVar7 == 3) && (bVar6 = isBound(this,var), !bVar6)) goto LAB_002bb618;
            bVar6 = (bool)(bVar4 & 1U);
            if (bVar10) {
              TVar13 = deref(this,var);
              var = TVar13.t._content;
              bVar6 = TVar13.q;
            }
            bVar10 = (bool)(bVar1 & 1U);
            if (bVar5) {
              TVar13 = deref(this,var_00);
              var_00 = TVar13.t._content;
              bVar10 = TVar13.q;
            }
            if (matchNextAux::toDo._cursor == matchNextAux::toDo._end) {
              Lib::
              Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec>_>
              ::expand(&matchNextAux::toDo);
            }
            ppVar2 = matchNextAux::toDo._cursor;
            ((matchNextAux::toDo._cursor)->first).q = bVar6;
            (ppVar2->first).t._content = var._content;
            (ppVar2->second).q = bVar10;
            (ppVar2->second).t._content = var_00._content;
            matchNextAux::toDo._cursor = matchNextAux::toDo._cursor + 1;
          }
          else {
            bind(this,__len,(sockaddr *)(ulong)local_54,(socklen_t)var._content);
          }
        }
        else {
LAB_002bb618:
          bind(this,(socklen_t)var._content,(sockaddr *)(ulong)local_50,__len);
        }
      }
    } while( true );
  }
  __fd = (uint)local_68.t._content;
LAB_002bb666:
  bind(this,__fd,(sockaddr *)0x0,(socklen_t)nodeTerm._content);
  return true;
}

Assistant:

bool SubstitutionTree<LeafData_>::InstMatcher::matchNextAux(TermList queryTerm, TermList nodeTerm, bool separate)
{
  unsigned specVar;
  TermSpec tsBinding;

  TermSpec tsNode(false, nodeTerm);

  if(queryTerm.isSpecialVar()){
    specVar = queryTerm.var();
    if(!findSpecVarBinding(specVar,tsBinding)) {
      bind(TermList(specVar,true), tsNode);
      return true;
    }
  } else {
    tsBinding = TermSpec(true, queryTerm);
  }

  if(tsBinding.q && tsBinding.t.isOrdinaryVar() && !isBound(tsBinding.t)) {
    bind(tsBinding.t, tsNode);
    return true;
  }

  bool success;

  if(nodeTerm.isTerm() && nodeTerm.term()->shared() && nodeTerm.term()->ground() &&
      tsBinding.q && tsBinding.t.isTerm() && tsBinding.t.term()->ground()) {
    success=nodeTerm.term()==tsBinding.t.term();
    goto finish;
  }

  static Stack<std::pair<TermSpec,TermSpec> > toDo;
  static DisagreementSetIterator dsit;

  toDo.reset();
  toDo.push(std::make_pair(tsBinding, tsNode));

  while(toDo.isNonEmpty()) {
    TermSpec ts1=toDo.top().first;
    TermSpec ts2=toDo.pop().second;
//    ASS(!ts2.q); //ts2 is always a node term

    dsit.reset(ts1.t, ts2.t, ts1.q!=ts2.q);
    while(dsit.hasNext()) {
      std::pair<TermList,TermList> disarg=dsit.next();
      TermList dt1=disarg.first;
      TermList dt2=disarg.second;

      bool dt1Bindable= !dt1.isTerm() && (ts1.q || !dt1.isOrdinaryVar());
      bool dt2Bindable= !dt2.isTerm() && (ts2.q || !dt2.isOrdinaryVar());

      if(!dt1Bindable && !dt2Bindable) {
	success=false;
	goto finish;
      }

      //we try to bind ordinary variables first, as binding a special
      //variable to an ordinary variable does not allow us to cut off
      //children when entering a node (a term to bind the special variable
      //may come later, so we want to keep it unbound)

      if(ts1.q && dt1.isOrdinaryVar() && !isBound(dt1)) {
	bind(dt1, TermSpec(ts2.q,dt2));
	continue;
      }
      if(ts2.q && dt2.isOrdinaryVar() && !isBound(dt2)) {
	bind(dt2, TermSpec(ts1.q,dt1));
	continue;
      }

      if(dt2.isSpecialVar() && !isBound(dt2)) {
	ASS(!ts2.q);
	bind(dt2, TermSpec(ts1.q,dt1));
	continue;
      }
      if(dt1.isSpecialVar() && !isBound(dt1)) {
	ASS(!ts1.q);
	bind(dt1, TermSpec(ts2.q,dt2));
	continue;
      }

      TermSpec deref1=TermSpec(ts1.q, dt1);
      TermSpec deref2=TermSpec(ts2.q, dt2);
      if(dt1Bindable) {
	ASS(isBound(dt1)); //if unbound, we would have assigned it earlier
	deref1=deref(dt1);
      }
      if(dt2Bindable) {
	ASS(isBound(dt2));
	deref2=deref(dt2);
      }

      toDo.push(std::make_pair(deref1, deref2));
    }
  }
  success=true;

finish:
  if(!success) {
    //if this matching was joined to the previous one, we don't
    //have to care about unbinding as caller will do this by calling
    //backtrack for the matching we're joined to.
    if(separate) {
      //we have to unbind variables, that were bound.
      backtrack();
    }
  }
  return success;
}